

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestHighbitsCollisions<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar4;
  double dev;
  double expected;
  int nbColls;
  int b;
  double maxCollDevExp;
  int maxCollDevNb;
  int maxCollDevBits;
  double maxCollDev;
  int maxBits;
  int minBits;
  size_t nbH;
  int origBits;
  undefined8 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  double dVar5;
  uint local_38;
  uint nbHBits;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes_00;
  bool local_1;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  uVar1 = FindMinBits_TargetCollisionShare
                    (in_stack_ffffffffffffffc0,
                     (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar2 = FindMaxBits_TargetCollisionNb
                    (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if ((int)uVar2 < 0x20) {
    printf("Testing collisions (high %2i-%2i bits) - ",(ulong)uVar1,(ulong)uVar2);
    hashes_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    nbHBits = 0;
    local_38 = 0;
    dVar5 = 1.0;
    for (; (int)uVar1 <= (int)uVar2; uVar1 = uVar1 + 1) {
      uVar3 = CountNbCollisions<unsigned_int>(hashes_00,nbHBits);
      dVar4 = EstimateNbCollisions((int)((ulong)dVar5 >> 0x20),SUB84(dVar5,0));
      if ((double)hashes_00 < (double)(int)uVar3 / dVar4) {
        dVar5 = dVar4;
        local_38 = uVar3;
        nbHBits = uVar1;
        hashes_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((double)(int)uVar3 / dVar4);
      }
    }
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",hashes_00,(ulong)nbHBits,(ulong)local_38,(int)dVar5)
    ;
    if ((double)hashes_00 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TestHighbitsCollisions ( std::vector<hashtype> & hashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = hashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits >= origBits) return true;

  printf("Testing collisions (high %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(hashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}